

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void run_test_in_the_current_process(TestSuite *suite,CgreenTest *test,TestReporter *reporter)

{
  uint32_t uVar1;
  uint32_t end_time_in_milliseconds;
  long in_RDX;
  int *in_RSI;
  uint32_t test_starting_milliseconds;
  CgreenTest *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  uVar1 = cgreen_time_get_current_milliseconds();
  (**(code **)(in_RDX + 0x10))(in_RDX,*(undefined8 *)(in_RSI + 4));
  if (*in_RSI == 0) {
    run_the_test_code((TestSuite *)CONCAT44(uVar1,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffd8,(TestReporter *)0x10ffef);
    end_time_in_milliseconds = cgreen_time_get_current_milliseconds();
    uVar1 = cgreen_time_duration_in_milliseconds(uVar1,end_time_in_milliseconds);
    *(uint32_t *)(in_RDX + 0x60) = uVar1;
    send_reporter_completion_notification((TestReporter *)0x11001b);
  }
  else {
    send_reporter_skipped_notification((TestReporter *)0x10ffd9);
  }
  (**(code **)(in_RDX + 0x40))(in_RDX,*(undefined8 *)(in_RSI + 8),in_RSI[10],0);
  return;
}

Assistant:

static void run_test_in_the_current_process(TestSuite *suite, CgreenTest *test, TestReporter *reporter)
{
    uint32_t test_starting_milliseconds = cgreen_time_get_current_milliseconds();

    (*reporter->start_test)(reporter, test->name);
    if (test->skip)
    {
        send_reporter_skipped_notification(reporter);
    }
    else
    {
        run_the_test_code(suite, test, reporter);
        reporter->duration = cgreen_time_duration_in_milliseconds(test_starting_milliseconds,
                                                                  cgreen_time_get_current_milliseconds());

        send_reporter_completion_notification(reporter);
    }
    (*reporter->finish_test)(reporter, test->filename, test->line, NULL);
}